

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_tools.cpp
# Opt level: O0

void dlib::tt::smelu(tensor *dest,tensor *src,float beta)

{
  ostream *poVar1;
  ostream *poVar2;
  string *a;
  undefined8 uVar3;
  float in_XMM0_Da;
  ostringstream dlib_o_out;
  undefined8 in_stack_fffffffffffffdf0;
  tensor *in_stack_fffffffffffffdf8;
  error_type t;
  tensor *in_stack_fffffffffffffe00;
  ostringstream local_190 [400];
  
  if (in_XMM0_Da <= 0.0) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar1 = std::operator<<((ostream *)local_190,"\n\nError detected at line ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x4b2);
    std::operator<<(poVar1,".\n");
    poVar1 = std::operator<<((ostream *)local_190,"Error detected in file ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor_tools.cpp"
                            );
    std::operator<<(poVar1,".\n");
    poVar1 = std::operator<<((ostream *)local_190,"Error detected in function ");
    poVar1 = std::operator<<(poVar1,"void dlib::tt::smelu(tensor &, const tensor &, const float)");
    std::operator<<(poVar1,".\n\n");
    poVar2 = std::operator<<((ostream *)local_190,"Failing expression was ");
    a = (string *)std::operator<<(poVar2,"beta > 0");
    t = (error_type)((ulong)poVar2 >> 0x20);
    std::operator<<((ostream *)a,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(local_190,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\n");
    uVar3 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar1,t,a);
    __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  cpu::smelu(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (float)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
  return;
}

Assistant:

void smelu (
        tensor& dest,
        const tensor& src,
        const float beta
    )
    {
        DLIB_CASSERT(beta > 0);
#ifdef DLIB_USE_CUDA
        cuda::smelu(dest, src, beta);
#else
        cpu::smelu(dest, src, beta);
#endif
    }